

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

Vector getNormalVector(Triangle *triangle)

{
  Vector VVar1;
  Point local_48;
  Point local_38;
  Vector local_28;
  
  local_48 = operator-(triangle->y,&triangle->x);
  local_38 = operator-(triangle->z,&triangle->x);
  local_28 = crossProduct(&local_48,&local_38);
  VVar1 = normalize(&local_28);
  return VVar1;
}

Assistant:

Vector getNormalVector(Triangle const& triangle)
{
  Vector v0v1 = triangle.y - triangle.x;
  Vector v0v2 = triangle.z - triangle.x;
  return normalize(crossProduct(v0v1, v0v2));
}